

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wave.c
# Opt level: O2

void key_callback(GLFWwindow *window,int key,int scancode,int action,int mods)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  
  if (action != 1) {
    return;
  }
  switch(key) {
  case 0x100:
    glfwSetWindowShouldClose(window,1);
    return;
  case 0x101:
  case 0x102:
  case 0x103:
  case 0x104:
  case 0x105:
    break;
  case 0x106:
    alpha = alpha + -5.0;
    return;
  case 0x107:
    alpha = alpha + 5.0;
    return;
  case 0x108:
    beta = beta + 5.0;
    return;
  case 0x109:
    beta = beta + -5.0;
    return;
  case 0x10a:
    zoom = zoom + -0.25;
    if (zoom < 0.0) {
      zoom = 0.0;
      return;
    }
    break;
  case 0x10b:
    zoom = zoom + 0.25;
    return;
  default:
    if (key == 0x20) {
      lVar3 = 0;
      for (lVar2 = 0; lVar2 != 0x32; lVar2 = lVar2 + 1) {
        dVar8 = (double)((int)lVar2 + -0x19);
        iVar5 = -0x19;
        for (lVar4 = 0; lVar4 != 20000; lVar4 = lVar4 + 400) {
          dVar7 = SQRT((double)iVar5 * (double)iVar5 + dVar8 * dVar8);
          dVar6 = 0.0;
          if (dVar7 < 2.5) {
            dVar6 = cos(dVar7 * 10.0 * 0.015707963267948967);
            dVar6 = dVar6 * -100.0;
          }
          lVar1 = lVar3 + lVar4;
          *(undefined8 *)((long)vx[0] + lVar1) = 0;
          *(undefined8 *)((long)vy[0] + lVar1) = 0;
          *(double *)((long)p[0] + lVar1) = dVar6;
          iVar5 = iVar5 + 1;
        }
        lVar3 = lVar3 + 8;
      }
      return;
    }
  }
  return;
}

Assistant:

void key_callback(GLFWwindow* window, int key, int scancode, int action, int mods)
{
    if (action != GLFW_PRESS)
        return;

    switch (key)
    {
        case GLFW_KEY_ESCAPE:
            glfwSetWindowShouldClose(window, GL_TRUE);
            break;
        case GLFW_KEY_SPACE:
            init_grid();
            break;
        case GLFW_KEY_LEFT:
            alpha += 5;
            break;
        case GLFW_KEY_RIGHT:
            alpha -= 5;
            break;
        case GLFW_KEY_UP:
            beta -= 5;
            break;
        case GLFW_KEY_DOWN:
            beta += 5;
            break;
        case GLFW_KEY_PAGE_UP:
            zoom -= 0.25f;
            if (zoom < 0.f)
                zoom = 0.f;
            break;
        case GLFW_KEY_PAGE_DOWN:
            zoom += 0.25f;
            break;
        default:
            break;
    }
}